

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_2d_avx2.h
# Opt level: O1

void convolve_2d_sr_ver_6tap_avx2
               (int16_t *im_block,int32_t w,int32_t h,InterpFilterParams *filter_params_y,
               int32_t subpel_y_q4,uint8_t *dst,int32_t dst_stride)

{
  ulong uVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  uint uVar12;
  int16_t *piVar13;
  int32_t iVar14;
  long lVar15;
  undefined1 (*pauVar16) [32];
  int16_t *piVar17;
  long lVar18;
  long lVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  __m128i d0;
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [64];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [32];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  __m128i d0_1;
  undefined1 auVar46 [32];
  undefined1 auVar47 [64];
  undefined1 auVar48 [32];
  undefined1 local_1e8 [32];
  undefined1 local_1c8 [32];
  undefined1 local_1a8 [32];
  undefined1 local_188 [32];
  undefined1 local_168 [32];
  undefined1 local_148 [32];
  undefined1 local_128 [32];
  
  uVar12 = (uint)filter_params_y->taps * (subpel_y_q4 & 0xfU);
  if (w == 2) {
    auVar20 = *(undefined1 (*) [16])(filter_params_y->filter_ptr + uVar12);
    auVar27 = vpshuflw_avx(auVar20,0xe9);
    auVar26 = vpshufb_avx(auVar20,_DAT_005110e0);
    auVar25._0_4_ = auVar27._0_4_;
    auVar25._4_4_ = auVar25._0_4_;
    auVar25._8_4_ = auVar25._0_4_;
    auVar25._12_4_ = auVar25._0_4_;
    auVar20 = vpshufhw_avx(auVar20,0xe9);
    auVar27 = vpshufd_avx(auVar20,0xaa);
    auVar35._8_8_ = 0;
    auVar35._0_8_ = *(ulong *)im_block;
    auVar20 = vpshufd_avx(auVar35,0x55);
    auVar43._8_8_ = 0;
    auVar43._0_8_ = *(ulong *)(im_block + 4);
    auVar39 = vpshufd_avx(auVar43,0x55);
    uVar12 = *(uint *)(im_block + 8);
    auVar31 = vpunpckldq_avx(auVar20,auVar43);
    auVar20 = vpinsrd_avx(auVar39,*(undefined4 *)(im_block + 8),1);
    auVar39 = vpunpcklwd_avx(auVar35,auVar31);
    auVar44._8_8_ = 0;
    auVar44._0_8_ = *(ulong *)(im_block + 4);
    auVar20 = vpunpcklwd_avx(auVar44,auVar20);
    lVar15 = 0;
    auVar38._8_4_ = 0x400;
    auVar38._0_8_ = 0x40000000400;
    auVar38._12_4_ = 0x400;
    do {
      auVar21 = auVar20;
      auVar39 = vpmaddwd_avx(auVar39,auVar25);
      auVar20 = vpinsrd_avx(ZEXT416(uVar12),*(undefined4 *)(im_block + lVar15 * 2 + 10),1);
      auVar31 = vpmaddwd_avx(auVar21,auVar26);
      auVar45._8_8_ = 0;
      auVar45._0_8_ = *(ulong *)(im_block + lVar15 * 2 + 10);
      auVar20 = vpunpcklwd_avx(auVar20,auVar45);
      uVar12 = *(uint *)(im_block + lVar15 * 2 + 0xc);
      auVar39 = vpaddd_avx(auVar31,auVar39);
      auVar39 = vpaddd_avx(auVar39,auVar38);
      auVar31 = vpmaddwd_avx(auVar20,auVar27);
      auVar39 = vpaddd_avx(auVar31,auVar39);
      auVar39 = vpsrad_avx(auVar39,0xb);
      auVar39 = vpackssdw_avx(auVar39,auVar39);
      auVar39 = vpackuswb_avx(auVar39,auVar39);
      vpextrw_avx(auVar39,0);
      vpextrw_avx(auVar39,1);
      lVar15 = lVar15 + 2;
      auVar39 = auVar21;
    } while (h != (int)lVar15);
  }
  else {
    auVar20 = *(undefined1 (*) [16])(filter_params_y->filter_ptr + uVar12);
    auVar29._16_16_ = auVar20;
    auVar29._0_16_ = auVar20;
    auVar4 = vpshuflw_avx2(auVar29,0xe9);
    auVar3 = vpshufb_avx2(auVar29,_DAT_00511080);
    auVar4 = vpshufd_avx2(auVar4,0);
    auVar29 = vpshufhw_avx2(auVar29,0xe9);
    auVar29 = vpshufd_avx2(auVar29,0xaa);
    auVar47 = ZEXT3264(auVar29);
    if (w == 4) {
      uVar1 = *(ulong *)(im_block + 0x10);
      auVar39._8_8_ = 0;
      auVar39._0_8_ = *(ulong *)(im_block + 4);
      auVar26._8_8_ = 0;
      auVar26._0_8_ = *(ulong *)im_block;
      auVar40._0_16_ = ZEXT116(0) * auVar39 + ZEXT116(1) * auVar26;
      auVar40._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar39;
      auVar31._8_8_ = 0;
      auVar31._0_8_ = *(ulong *)(im_block + 8);
      auVar33._0_16_ = ZEXT116(0) * auVar31 + ZEXT116(1) * auVar39;
      auVar33._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar31;
      auVar40 = vpunpcklwd_avx2(auVar40,auVar33);
      auVar27._8_8_ = 0;
      auVar27._0_8_ = *(ulong *)(im_block + 0xc);
      auVar30._0_16_ = ZEXT116(0) * auVar27 + ZEXT116(1) * auVar31;
      auVar30._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar27;
      auVar20._8_8_ = 0;
      auVar20._0_8_ = uVar1;
      auVar42._0_16_ = ZEXT116(0) * auVar20 + ZEXT116(1) * auVar27;
      auVar42._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar20;
      auVar42 = vpunpcklwd_avx2(auVar30,auVar42);
      lVar15 = 0;
      auVar48._8_4_ = 0x400;
      auVar48._0_8_ = 0x40000000400;
      auVar48._12_4_ = 0x400;
      auVar48._16_4_ = 0x400;
      auVar48._20_4_ = 0x400;
      auVar48._24_4_ = 0x400;
      auVar48._28_4_ = 0x400;
      do {
        auVar36._8_8_ = 0;
        auVar36._0_8_ = *(ulong *)(im_block + lVar15 * 4 + 0x14);
        auVar21._8_8_ = 0;
        auVar21._0_8_ = uVar1;
        auVar37._0_16_ = ZEXT116(0) * auVar36 + ZEXT116(1) * auVar21;
        auVar37._16_16_ = ZEXT116(1) * auVar36;
        uVar1 = *(ulong *)(im_block + lVar15 * 4 + 0x18);
        auVar22._8_8_ = 0;
        auVar22._0_8_ = uVar1;
        auVar41._0_16_ = ZEXT116(0) * auVar22 + ZEXT116(1) * auVar36;
        auVar41._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar22;
        auVar40 = vpmaddwd_avx2(auVar4,auVar40);
        auVar33 = vpmaddwd_avx2(auVar3,auVar42);
        auVar30 = vpunpcklwd_avx2(auVar37,auVar41);
        auVar40 = vpaddd_avx2(auVar40,auVar33);
        auVar40 = vpaddd_avx2(auVar40,auVar48);
        auVar33 = vpmaddwd_avx2(auVar29,auVar30);
        auVar40 = vpaddd_avx2(auVar40,auVar33);
        auVar40 = vpsrad_avx2(auVar40,0xb);
        auVar40 = vpackssdw_avx2(auVar40,auVar40);
        auVar40 = vpackuswb_avx2(auVar40,auVar40);
        *(int *)dst = auVar40._0_4_;
        *(int *)(dst + dst_stride) = auVar40._16_4_;
        dst = dst + dst_stride * 2;
        lVar15 = lVar15 + 2;
        auVar40 = auVar42;
        auVar42 = auVar30;
      } while (h != (int)lVar15);
    }
    else if (w == 8) {
      auVar40 = *(undefined1 (*) [32])im_block;
      auVar42 = *(undefined1 (*) [32])(im_block + 8);
      auVar48 = *(undefined1 (*) [32])(im_block + 0x10);
      auVar33 = *(undefined1 (*) [32])(im_block + 0x18);
      if (subpel_y_q4 == 8) {
        pauVar16 = (undefined1 (*) [32])(im_block + 0x28);
        auVar28._8_4_ = 0x400;
        auVar28._0_8_ = 0x40000000400;
        auVar28._12_4_ = 0x400;
        auVar28._16_4_ = 0x400;
        auVar28._20_4_ = 0x400;
        auVar28._24_4_ = 0x400;
        auVar28._28_4_ = 0x400;
        do {
          auVar29 = auVar48;
          auVar23 = auVar33;
          auVar33 = *pauVar16;
          auVar40 = vpaddw_avx2(auVar33,auVar40);
          auVar37 = vpunpcklwd_avx2(auVar29,auVar23);
          auVar41 = vpunpckhwd_avx2(auVar29,auVar23);
          auVar48 = *(undefined1 (*) [32])(pauVar16[-1] + 0x10);
          auVar42 = vpaddw_avx2(auVar48,auVar42);
          auVar24 = vpunpcklwd_avx2(auVar40,auVar42);
          auVar30 = vpunpckhwd_avx2(auVar40,auVar42);
          auVar42 = vpmaddwd_avx2(auVar24,auVar4);
          auVar40 = vpmaddwd_avx2(auVar3,auVar37);
          auVar30 = vpmaddwd_avx2(auVar4,auVar30);
          auVar41 = vpmaddwd_avx2(auVar41,auVar3);
          auVar40 = vpaddd_avx2(auVar40,auVar28);
          auVar40 = vpaddd_avx2(auVar42,auVar40);
          auVar42 = vpsrad_avx2(auVar40,0xb);
          auVar40 = vpaddd_avx2(auVar41,auVar28);
          auVar40 = vpaddd_avx2(auVar30,auVar40);
          auVar40 = vpsrad_avx2(auVar40,0xb);
          auVar40 = vpackssdw_avx2(auVar42,auVar40);
          auVar40 = vpackuswb_avx2(auVar40,auVar23);
          *(long *)dst = auVar40._0_8_;
          *(long *)(dst + dst_stride) = auVar40._16_8_;
          dst = dst + dst_stride * 2;
          pauVar16 = pauVar16 + 1;
          h = h + -2;
          auVar42 = auVar23;
          auVar40 = auVar29;
        } while (h != 0);
      }
      else {
        auVar30 = vpunpcklwd_avx2(auVar40,auVar42);
        auVar41 = vpunpcklwd_avx2(auVar48,auVar33);
        auVar40 = vpunpckhwd_avx2(auVar40,auVar42);
        auVar42 = vpunpckhwd_avx2(auVar48,auVar33);
        pauVar16 = (undefined1 (*) [32])(im_block + 0x28);
        auVar24._8_4_ = 0x400;
        auVar24._0_8_ = 0x40000000400;
        auVar24._12_4_ = 0x400;
        auVar24._16_4_ = 0x400;
        auVar24._20_4_ = 0x400;
        auVar24._24_4_ = 0x400;
        auVar24._28_4_ = 0x400;
        do {
          auVar48 = vpmaddwd_avx2(auVar4,auVar30);
          auVar33 = vpmaddwd_avx2(auVar3,auVar41);
          auVar23 = vpunpcklwd_avx2(*(undefined1 (*) [32])(pauVar16[-1] + 0x10),*pauVar16);
          auVar30 = vpmaddwd_avx2(auVar4,auVar40);
          auVar37 = vpmaddwd_avx2(auVar3,auVar42);
          auVar28 = vpunpckhwd_avx2(*(undefined1 (*) [32])(pauVar16[-1] + 0x10),*pauVar16);
          auVar40 = vpaddd_avx2(auVar33,auVar48);
          auVar33 = vpmaddwd_avx2(auVar29,auVar23);
          auVar48 = vpaddd_avx2(auVar30,auVar37);
          auVar30 = vpmaddwd_avx2(auVar29,auVar28);
          auVar40 = vpaddd_avx2(auVar40,auVar24);
          auVar40 = vpaddd_avx2(auVar40,auVar33);
          auVar33 = vpsrad_avx2(auVar40,0xb);
          auVar40 = vpaddd_avx2(auVar48,auVar24);
          auVar40 = vpaddd_avx2(auVar30,auVar40);
          auVar40 = vpsrad_avx2(auVar40,0xb);
          auVar40 = vpackssdw_avx2(auVar33,auVar40);
          auVar40 = vpackuswb_avx2(auVar40,auVar24);
          *(long *)dst = auVar40._0_8_;
          *(long *)(dst + dst_stride) = auVar40._16_8_;
          dst = dst + dst_stride * 2;
          pauVar16 = pauVar16 + 1;
          h = h + -2;
          auVar40 = auVar42;
          auVar30 = auVar41;
          auVar42 = auVar28;
          auVar41 = auVar23;
        } while (h != 0);
      }
    }
    else if (w == 0x10) {
      auVar29 = *(undefined1 (*) [32])im_block;
      auVar40 = *(undefined1 (*) [32])(im_block + 0x10);
      auVar42 = *(undefined1 (*) [32])(im_block + 0x20);
      auVar33 = *(undefined1 (*) [32])(im_block + 0x30);
      auVar48 = *(undefined1 (*) [32])(im_block + 0x40);
      auVar34 = ZEXT3264(auVar48);
      if (subpel_y_q4 == 8) {
        pauVar16 = (undefined1 (*) [32])(im_block + 0x60);
        auVar23._8_4_ = 0x400;
        auVar23._0_8_ = 0x40000000400;
        auVar23._12_4_ = 0x400;
        auVar23._16_4_ = 0x400;
        auVar23._20_4_ = 0x400;
        auVar23._24_4_ = 0x400;
        auVar23._28_4_ = 0x400;
        do {
          auVar48 = *pauVar16;
          auVar32 = auVar34._0_32_;
          auVar41 = vpaddw_avx2(auVar32,auVar40);
          auVar24 = vpunpcklwd_avx2(auVar42,auVar33);
          auVar37 = vpunpckhwd_avx2(auVar42,auVar33);
          auVar40 = vpaddw_avx2(auVar48,auVar40);
          auVar28 = vpunpcklwd_avx2(auVar33,auVar32);
          auVar5 = vpunpckhwd_avx2(auVar33,auVar32);
          auVar30 = pauVar16[-1];
          auVar29 = vpaddw_avx2(auVar30,auVar29);
          auVar46 = vpunpcklwd_avx2(auVar29,auVar41);
          auVar41 = vpunpckhwd_avx2(auVar29,auVar41);
          auVar29 = vpaddw_avx2(auVar30,auVar42);
          auVar8 = vpunpcklwd_avx2(auVar40,auVar29);
          auVar6 = vpunpckhwd_avx2(auVar40,auVar29);
          auVar40 = vpmaddwd_avx2(auVar46,auVar4);
          auVar29 = vpmaddwd_avx2(auVar3,auVar24);
          auVar41 = vpmaddwd_avx2(auVar41,auVar4);
          auVar37 = vpmaddwd_avx2(auVar37,auVar3);
          auVar24 = vpmaddwd_avx2(auVar8,auVar4);
          auVar28 = vpmaddwd_avx2(auVar28,auVar3);
          auVar6 = vpmaddwd_avx2(auVar6,auVar4);
          auVar5 = vpmaddwd_avx2(auVar5,auVar3);
          auVar29 = vpaddd_avx2(auVar29,auVar23);
          auVar29 = vpaddd_avx2(auVar40,auVar29);
          auVar40 = vpsrad_avx2(auVar29,0xb);
          auVar29 = vpaddd_avx2(auVar37,auVar23);
          auVar29 = vpaddd_avx2(auVar29,auVar41);
          auVar29 = vpsrad_avx2(auVar29,0xb);
          auVar29 = vpackssdw_avx2(auVar40,auVar29);
          auVar40 = vpaddd_avx2(auVar28,auVar23);
          auVar40 = vpaddd_avx2(auVar24,auVar40);
          auVar41 = vpsrad_avx2(auVar40,0xb);
          auVar40 = vpaddd_avx2(auVar5,auVar23);
          auVar40 = vpaddd_avx2(auVar6,auVar40);
          auVar40 = vpsrad_avx2(auVar40,0xb);
          auVar40 = vpackssdw_avx2(auVar41,auVar40);
          auVar29 = vpackuswb_avx2(auVar29,auVar40);
          auVar29 = vpermq_avx2(auVar29,0xd8);
          *(undefined1 (*) [16])dst = auVar29._0_16_;
          *(undefined1 (*) [16])(*(undefined1 (*) [16])dst + dst_stride) = auVar29._16_16_;
          dst = *(undefined1 (*) [16])dst + dst_stride * 2;
          pauVar16 = pauVar16 + 2;
          auVar34 = ZEXT3264(auVar48);
          h = h + -2;
          auVar40 = auVar33;
          auVar29 = auVar42;
          auVar42 = auVar32;
          auVar33 = auVar30;
        } while (h != 0);
      }
      else {
        auVar41 = vpunpcklwd_avx2(auVar29,auVar40);
        local_1c8 = vpunpcklwd_avx2(auVar42,auVar33);
        auVar29 = vpunpckhwd_avx2(auVar29,auVar40);
        auVar30 = vpunpckhwd_avx2(auVar42,auVar33);
        auVar37 = vpunpcklwd_avx2(auVar40,auVar42);
        auVar24 = vpunpcklwd_avx2(auVar33,auVar48);
        auVar40 = vpunpckhwd_avx2(auVar40,auVar42);
        auVar42 = vpunpckhwd_avx2(auVar33,auVar48);
        pauVar16 = (undefined1 (*) [32])(im_block + 0x60);
        local_1a8._8_4_ = 0x400;
        local_1a8._0_8_ = 0x40000000400;
        local_1a8._12_4_ = 0x400;
        local_1a8._16_4_ = 0x400;
        local_1a8._20_4_ = 0x400;
        local_1a8._24_4_ = 0x400;
        local_1a8._28_4_ = 0x400;
        do {
          auVar37 = vpmaddwd_avx2(auVar37,auVar4);
          auVar28 = vpmaddwd_avx2(auVar4,auVar40);
          auVar40 = vpmaddwd_avx2(auVar41,auVar4);
          auVar46 = auVar47._0_32_;
          auVar33 = vpmaddwd_avx2(auVar29,auVar4);
          auVar29 = pauVar16[-1];
          auVar48 = vpmaddwd_avx2(local_1c8,auVar3);
          auVar6 = vpunpcklwd_avx2(auVar34._0_32_,auVar29);
          auVar41 = vpmaddwd_avx2(auVar3,auVar30);
          auVar23 = vpunpckhwd_avx2(auVar34._0_32_,auVar29);
          auVar48 = vpaddd_avx2(auVar48,auVar40);
          auVar40 = *pauVar16;
          auVar34 = ZEXT3264(auVar40);
          auVar33 = vpaddd_avx2(auVar33,auVar41);
          auVar41 = vpmaddwd_avx2(auVar3,auVar24);
          auVar41 = vpaddd_avx2(auVar37,auVar41);
          auVar37 = vpmaddwd_avx2(auVar3,auVar42);
          auVar37 = vpaddd_avx2(auVar37,auVar28);
          auVar28 = vpmaddwd_avx2(auVar6,auVar46);
          auVar48 = vpaddd_avx2(auVar48,local_1a8);
          auVar48 = vpaddd_avx2(auVar48,auVar28);
          auVar28 = vpmaddwd_avx2(auVar23,auVar46);
          auVar33 = vpaddd_avx2(auVar33,local_1a8);
          auVar33 = vpaddd_avx2(auVar33,auVar28);
          auVar5 = vpunpcklwd_avx2(auVar29,auVar40);
          auVar28 = vpunpckhwd_avx2(auVar29,auVar40);
          auVar40 = vpsrad_avx2(auVar48,0xb);
          auVar29 = vpsrad_avx2(auVar33,0xb);
          auVar29 = vpackssdw_avx2(auVar40,auVar29);
          auVar48 = vpmaddwd_avx2(auVar5,auVar46);
          auVar40 = vpaddd_avx2(auVar41,local_1a8);
          auVar40 = vpaddd_avx2(auVar40,auVar48);
          auVar33 = vpmaddwd_avx2(auVar28,auVar46);
          auVar48 = vpaddd_avx2(auVar37,local_1a8);
          auVar48 = vpaddd_avx2(auVar48,auVar33);
          auVar40 = vpsrad_avx2(auVar40,0xb);
          auVar48 = vpsrad_avx2(auVar48,0xb);
          auVar40 = vpackssdw_avx2(auVar40,auVar48);
          auVar29 = vpackuswb_avx2(auVar29,auVar40);
          auVar47 = ZEXT3264(auVar46);
          auVar29 = vpermq_avx2(auVar29,0xd8);
          *(undefined1 (*) [16])dst = auVar29._0_16_;
          *(undefined1 (*) [16])(*(undefined1 (*) [16])dst + dst_stride) = auVar29._16_16_;
          dst = *(undefined1 (*) [16])dst + dst_stride * 2;
          pauVar16 = pauVar16 + 2;
          h = h + -2;
          auVar40 = auVar42;
          auVar29 = auVar30;
          auVar37 = auVar24;
          auVar42 = auVar28;
          auVar24 = auVar5;
          auVar30 = auVar23;
          auVar41 = local_1c8;
          local_1c8 = auVar6;
        } while (h != 0);
      }
    }
    else {
      lVar15 = (long)w;
      piVar17 = im_block + lVar15 * 6 + 0x10;
      piVar13 = im_block + lVar15 * 5 + 0x10;
      lVar19 = 0;
      do {
        pauVar16 = (undefined1 (*) [32])(dst + lVar19);
        auVar41 = *(undefined1 (*) [32])(im_block + lVar19 + lVar15 * 4);
        auVar29 = *(undefined1 (*) [32])(im_block + lVar19 + lVar15);
        auVar40 = *(undefined1 (*) [32])(im_block + lVar19 + lVar15 + 0x10);
        auVar24 = vpunpcklwd_avx2(*(undefined1 (*) [32])(im_block + lVar19),auVar29);
        auVar42 = *(undefined1 (*) [32])(im_block + lVar19 + lVar15 * 2);
        auVar48 = *(undefined1 (*) [32])(im_block + lVar19 + lVar15 * 2 + 0x10);
        auVar46 = auVar47._0_32_;
        auVar33 = *(undefined1 (*) [32])(im_block + lVar19 + lVar15 * 3);
        auVar30 = *(undefined1 (*) [32])(im_block + lVar19 + lVar15 * 3 + 0x10);
        local_188 = vpunpcklwd_avx2(auVar42,auVar33);
        auVar37 = vpunpckhwd_avx2(*(undefined1 (*) [32])(im_block + lVar19),auVar29);
        local_1c8 = vpunpckhwd_avx2(auVar42,auVar33);
        auVar28 = vpunpcklwd_avx2(auVar29,auVar42);
        auVar6 = vpunpcklwd_avx2(auVar33,auVar41);
        auVar42 = vpunpckhwd_avx2(auVar29,auVar42);
        auVar33 = vpunpckhwd_avx2(auVar33,auVar41);
        local_148 = vpunpcklwd_avx2(*(undefined1 (*) [32])(im_block + lVar19 + 0x10),auVar40);
        local_1e8 = vpunpcklwd_avx2(auVar48,auVar30);
        local_128 = vpunpckhwd_avx2(*(undefined1 (*) [32])(im_block + lVar19 + 0x10),auVar40);
        local_168 = vpunpcklwd_avx2(auVar40,auVar48);
        auVar40 = vpunpckhwd_avx2(auVar40,auVar48);
        local_1a8 = vpunpckhwd_avx2(auVar48,auVar30);
        auVar29 = *(undefined1 (*) [32])(im_block + lVar19 + lVar15 * 4 + 0x10);
        auVar23 = vpunpcklwd_avx2(auVar30,auVar29);
        auVar48 = vpunpckhwd_avx2(auVar30,auVar29);
        lVar18 = 0;
        auVar5._8_4_ = 0x400;
        auVar5._0_8_ = 0x40000000400;
        auVar5._12_4_ = 0x400;
        auVar5._16_4_ = 0x400;
        auVar5._20_4_ = 0x400;
        auVar5._24_4_ = 0x400;
        auVar5._28_4_ = 0x400;
        iVar14 = h;
        do {
          auVar9 = auVar23;
          auVar30 = vpmaddwd_avx2(auVar4,auVar24);
          auVar24 = vpmaddwd_avx2(auVar3,local_188);
          auVar30 = vpaddd_avx2(auVar24,auVar30);
          auVar37 = vpmaddwd_avx2(auVar4,auVar37);
          auVar24 = vpmaddwd_avx2(auVar3,local_1c8);
          auVar37 = vpaddd_avx2(auVar24,auVar37);
          auVar24 = vpmaddwd_avx2(auVar4,auVar28);
          auVar28 = vpmaddwd_avx2(auVar6,auVar3);
          auVar24 = vpaddd_avx2(auVar28,auVar24);
          auVar42 = vpmaddwd_avx2(auVar4,auVar42);
          auVar28 = vpmaddwd_avx2(auVar33,auVar3);
          auVar28 = vpaddd_avx2(auVar42,auVar28);
          auVar42 = vpmaddwd_avx2(auVar4,local_148);
          local_148 = local_1e8;
          auVar23 = vpmaddwd_avx2(auVar3,local_1e8);
          auVar42 = vpaddd_avx2(auVar42,auVar23);
          auVar23 = vpmaddwd_avx2(auVar4,local_128);
          local_128 = local_1a8;
          auVar8 = vpmaddwd_avx2(auVar3,local_1a8);
          auVar23 = vpaddd_avx2(auVar23,auVar8);
          auVar8 = vpmaddwd_avx2(auVar4,local_168);
          auVar32 = vpmaddwd_avx2(auVar9,auVar3);
          auVar8 = vpaddd_avx2(auVar8,auVar32);
          auVar40 = vpmaddwd_avx2(auVar4,auVar40);
          auVar32 = vpmaddwd_avx2(auVar48,auVar3);
          auVar32 = vpaddd_avx2(auVar32,auVar40);
          auVar30 = vpaddd_avx2(auVar30,auVar5);
          auVar40 = *(undefined1 (*) [32])((long)piVar13 + lVar18 + -0x20);
          auVar10 = vpunpcklwd_avx2(auVar41,auVar40);
          auVar2 = vpmaddwd_avx2(auVar10,auVar46);
          auVar30 = vpaddd_avx2(auVar30,auVar2);
          auVar2 = vpunpckhwd_avx2(auVar41,auVar40);
          auVar41 = vpaddd_avx2(auVar37,auVar5);
          auVar37 = vpmaddwd_avx2(auVar2,auVar46);
          auVar41 = vpaddd_avx2(auVar41,auVar37);
          auVar37 = vpsrad_avx2(auVar30,0xb);
          auVar30 = vpsrad_avx2(auVar41,0xb);
          auVar30 = vpackssdw_avx2(auVar37,auVar30);
          auVar41 = vpaddd_avx2(auVar42,auVar5);
          auVar42 = *(undefined1 (*) [32])((long)piVar13 + lVar18);
          local_1e8 = vpunpcklwd_avx2(auVar29,auVar42);
          auVar37 = vpmaddwd_avx2(local_1e8,auVar46);
          auVar41 = vpaddd_avx2(auVar37,auVar41);
          local_1a8 = vpunpckhwd_avx2(auVar29,auVar42);
          auVar29 = vpaddd_avx2(auVar23,auVar5);
          auVar37 = vpmaddwd_avx2(local_1a8,auVar46);
          auVar29 = vpaddd_avx2(auVar29,auVar37);
          auVar41 = vpsrad_avx2(auVar41,0xb);
          auVar29 = vpsrad_avx2(auVar29,0xb);
          auVar29 = vpackssdw_avx2(auVar41,auVar29);
          auVar30 = vpackuswb_avx2(auVar30,auVar29);
          auVar41 = *(undefined1 (*) [32])((long)piVar17 + lVar18 + -0x20);
          auVar29 = *(undefined1 (*) [32])((long)piVar17 + lVar18);
          *pauVar16 = auVar30;
          auVar30 = vpaddd_avx2(auVar24,auVar5);
          auVar11 = vpunpcklwd_avx2(auVar40,auVar41);
          auVar37 = vpmaddwd_avx2(auVar11,auVar46);
          auVar30 = vpaddd_avx2(auVar37,auVar30);
          auVar7 = vpunpckhwd_avx2(auVar40,auVar41);
          auVar40 = vpaddd_avx2(auVar5,auVar28);
          auVar37 = vpmaddwd_avx2(auVar7,auVar46);
          auVar40 = vpaddd_avx2(auVar37,auVar40);
          auVar30 = vpsrad_avx2(auVar30,0xb);
          auVar40 = vpsrad_avx2(auVar40,0xb);
          auVar40 = vpackssdw_avx2(auVar30,auVar40);
          auVar30 = vpaddd_avx2(auVar8,auVar5);
          auVar23 = vpunpcklwd_avx2(auVar42,auVar29);
          auVar37 = vpmaddwd_avx2(auVar23,auVar46);
          auVar30 = vpaddd_avx2(auVar30,auVar37);
          auVar8 = vpunpckhwd_avx2(auVar42,auVar29);
          auVar42 = vpaddd_avx2(auVar32,auVar5);
          auVar37 = vpmaddwd_avx2(auVar8,auVar46);
          auVar42 = vpaddd_avx2(auVar42,auVar37);
          auVar30 = vpsrad_avx2(auVar30,0xb);
          auVar42 = vpsrad_avx2(auVar42,0xb);
          auVar42 = vpackssdw_avx2(auVar30,auVar42);
          auVar40 = vpackuswb_avx2(auVar40,auVar42);
          *(undefined1 (*) [32])(*pauVar16 + dst_stride) = auVar40;
          pauVar16 = (undefined1 (*) [32])(*pauVar16 + dst_stride * 2);
          lVar18 = lVar18 + (long)(w * 2) * 2;
          iVar14 = iVar14 + -2;
          auVar37 = local_1c8;
          auVar40 = auVar48;
          auVar24 = local_188;
          auVar42 = auVar33;
          auVar28 = auVar6;
          auVar48 = auVar8;
          auVar33 = auVar7;
          auVar6 = auVar11;
          local_1c8 = auVar2;
          local_188 = auVar10;
          local_168 = auVar9;
        } while (iVar14 != 0);
        lVar19 = lVar19 + 0x20;
        piVar17 = piVar17 + 0x20;
        piVar13 = piVar13 + 0x20;
        auVar47 = ZEXT3264(auVar46);
      } while (lVar19 < lVar15);
    }
  }
  return;
}

Assistant:

static void convolve_2d_sr_ver_6tap_avx2(
    const int16_t *const im_block, const int32_t w, const int32_t h,
    const InterpFilterParams *const filter_params_y, const int32_t subpel_y_q4,
    uint8_t *dst, const int32_t dst_stride) {
  const int16_t *im = im_block;
  int32_t y;

  if (w == 2) {
    __m128i coeffs_128[3], s_32[6], ss_128[3];

    prepare_coeffs_6tap_ssse3(filter_params_y, subpel_y_q4, coeffs_128);

    s_32[0] = _mm_cvtsi32_si128(*(int32_t *)(im + 0 * 2));
    s_32[1] = _mm_cvtsi32_si128(*(int32_t *)(im + 1 * 2));
    s_32[2] = _mm_cvtsi32_si128(*(int32_t *)(im + 2 * 2));
    s_32[3] = _mm_cvtsi32_si128(*(int32_t *)(im + 3 * 2));
    s_32[4] = _mm_cvtsi32_si128(*(int32_t *)(im + 4 * 2));

    const __m128i src01 = _mm_unpacklo_epi32(s_32[0], s_32[1]);
    const __m128i src12 = _mm_unpacklo_epi32(s_32[1], s_32[2]);
    const __m128i src23 = _mm_unpacklo_epi32(s_32[2], s_32[3]);
    const __m128i src34 = _mm_unpacklo_epi32(s_32[3], s_32[4]);

    ss_128[0] = _mm_unpacklo_epi16(src01, src12);
    ss_128[1] = _mm_unpacklo_epi16(src23, src34);

    y = h;
    do {
      const __m128i res =
          xy_y_convolve_6tap_2x2_sse2(im, s_32, ss_128, coeffs_128);
      xy_y_round_store_2x2_sse2(res, dst, dst_stride);
      im += 2 * 2;
      dst += 2 * dst_stride;
      y -= 2;
    } while (y);
  } else {
    __m256i coeffs_256[3];

    prepare_coeffs_6tap_avx2(filter_params_y, subpel_y_q4, coeffs_256);

    if (w == 4) {
      __m128i s_64[6];
      __m256i s_256[6], ss_256[3];

      s_64[0] = _mm_loadl_epi64((__m128i *)(im + 0 * 4));
      s_64[1] = _mm_loadl_epi64((__m128i *)(im + 1 * 4));
      s_64[2] = _mm_loadl_epi64((__m128i *)(im + 2 * 4));
      s_64[3] = _mm_loadl_epi64((__m128i *)(im + 3 * 4));
      s_64[4] = _mm_loadl_epi64((__m128i *)(im + 4 * 4));

      // Load lines a and b. Line a to lower 128, line b to upper 128
      s_256[0] = _mm256_setr_m128i(s_64[0], s_64[1]);
      s_256[1] = _mm256_setr_m128i(s_64[1], s_64[2]);
      s_256[2] = _mm256_setr_m128i(s_64[2], s_64[3]);
      s_256[3] = _mm256_setr_m128i(s_64[3], s_64[4]);

      ss_256[0] = _mm256_unpacklo_epi16(s_256[0], s_256[1]);
      ss_256[1] = _mm256_unpacklo_epi16(s_256[2], s_256[3]);

      y = h;
      do {
        const __m256i res =
            xy_y_convolve_6tap_4x2_avx2(im, s_64, ss_256, coeffs_256);
        xy_y_round_store_4x2_avx2(res, dst, dst_stride);
        im += 2 * 4;
        dst += 2 * dst_stride;
        y -= 2;
      } while (y);
    } else if (w == 8) {
      __m256i s_256[6], r[2];

      s_256[0] = _mm256_loadu_si256((__m256i *)(im + 0 * 8));
      s_256[1] = _mm256_loadu_si256((__m256i *)(im + 1 * 8));
      s_256[2] = _mm256_loadu_si256((__m256i *)(im + 2 * 8));
      s_256[3] = _mm256_loadu_si256((__m256i *)(im + 3 * 8));
      y = h;

      if (subpel_y_q4 != 8) {
        __m256i ss_256[6];

        ss_256[0] = _mm256_unpacklo_epi16(s_256[0], s_256[1]);
        ss_256[1] = _mm256_unpacklo_epi16(s_256[2], s_256[3]);

        ss_256[3] = _mm256_unpackhi_epi16(s_256[0], s_256[1]);
        ss_256[4] = _mm256_unpackhi_epi16(s_256[2], s_256[3]);

        do {
          xy_y_convolve_6tap_8x2_avx2(im, ss_256, coeffs_256, r);
          xy_y_round_store_8x2_avx2(r, dst, dst_stride);
          im += 2 * 8;
          dst += 2 * dst_stride;
          y -= 2;
        } while (y);
      } else {
        do {
          xy_y_convolve_6tap_8x2_half_pel_avx2(im, coeffs_256, s_256, r);
          xy_y_round_store_8x2_avx2(r, dst, dst_stride);
          im += 2 * 8;
          dst += 2 * dst_stride;
          y -= 2;
        } while (y);
      }
    } else if (w == 16) {
      __m256i s_256[6];

      s_256[0] = _mm256_loadu_si256((__m256i *)(im + 0 * 16));
      s_256[1] = _mm256_loadu_si256((__m256i *)(im + 1 * 16));
      s_256[2] = _mm256_loadu_si256((__m256i *)(im + 2 * 16));
      s_256[3] = _mm256_loadu_si256((__m256i *)(im + 3 * 16));
      s_256[4] = _mm256_loadu_si256((__m256i *)(im + 4 * 16));
      y = h;

      if (subpel_y_q4 != 8) {
        __m256i ss_256[6], tt_256[6], r[4];

        ss_256[0] = _mm256_unpacklo_epi16(s_256[0], s_256[1]);
        ss_256[1] = _mm256_unpacklo_epi16(s_256[2], s_256[3]);
        ss_256[3] = _mm256_unpackhi_epi16(s_256[0], s_256[1]);
        ss_256[4] = _mm256_unpackhi_epi16(s_256[2], s_256[3]);

        tt_256[0] = _mm256_unpacklo_epi16(s_256[1], s_256[2]);
        tt_256[1] = _mm256_unpacklo_epi16(s_256[3], s_256[4]);
        tt_256[3] = _mm256_unpackhi_epi16(s_256[1], s_256[2]);
        tt_256[4] = _mm256_unpackhi_epi16(s_256[3], s_256[4]);

        do {
          xy_y_convolve_6tap_16x2_avx2(im, 16, s_256, ss_256, tt_256,
                                       coeffs_256, r);
          xy_y_round_store_16x2_avx2(r, dst, dst_stride);
          im += 2 * 16;
          dst += 2 * dst_stride;
          y -= 2;
        } while (y);
      } else {
        __m256i ss_256[4], r[4];

        do {
          xy_y_convolve_6tap_16x2_half_pel_avx2(im, 16, s_256, ss_256,
                                                coeffs_256, r);
          xy_y_round_store_16x2_avx2(r, dst, dst_stride);

          im += 2 * 16;
          dst += 2 * dst_stride;
          y -= 2;
        } while (y);
      }
    } else {
      int32_t x = 0;

      assert(!(w % 32));

      __m256i s_256[2][6], ss_256[2][6], tt_256[2][6], r0[4], r1[4];

      do {
        const int16_t *s = im + x;
        uint8_t *d = dst + x;

        loadu_unpack_16bit_5rows_avx2(s, w, s_256[0], ss_256[0], tt_256[0]);
        loadu_unpack_16bit_5rows_avx2(s + 16, w, s_256[1], ss_256[1],
                                      tt_256[1]);

        y = h;
        do {
          xy_y_convolve_6tap_16x2_avx2(s, w, s_256[0], ss_256[0], tt_256[0],
                                       coeffs_256, r0);
          xy_y_convolve_6tap_16x2_avx2(s + 16, w, s_256[1], ss_256[1],
                                       tt_256[1], coeffs_256, r1);

          xy_y_round_store_32_avx2(r0 + 0, r1 + 0, d);
          xy_y_round_store_32_avx2(r0 + 2, r1 + 2, d + dst_stride);

          s += 2 * w;
          d += 2 * dst_stride;
          y -= 2;
        } while (y);

        x += 32;
      } while (x < w);
    }
  }
}